

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnImportTable
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index table_index,Type elem_type,Limits *elem_limits)

{
  Module *this_00;
  uint64_t uVar1;
  bool bVar2;
  pointer pTVar3;
  Location local_c0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_a0;
  string local_98;
  string local_68;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> local_48;
  unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::TableImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pTVar3->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_98,(string_view *)&this_local);
  pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pTVar3->super_ImportMixin<(wabt::ExternalKind)1>).super_Import.field_name,
             (string *)&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::operator->
                     (&local_48);
  bVar2 = elem_limits->is_shared;
  (pTVar3->table).elem_limits.has_max = elem_limits->has_max;
  (pTVar3->table).elem_limits.is_shared = bVar2;
  uVar1 = elem_limits->max;
  (pTVar3->table).elem_limits.initial = elem_limits->initial;
  (pTVar3->table).elem_limits.max = uVar1;
  this_00 = this->module_;
  GetLocation(&local_c0,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
            ((wabt *)&local_a0,&local_48,&local_c0);
  Module::AppendField(this_00,&local_a0);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_a0);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
            (&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportTable(Index import_index,
                                     string_view module_name,
                                     string_view field_name,
                                     Index table_index,
                                     Type elem_type,
                                     const Limits* elem_limits) {
  auto import = MakeUnique<TableImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->table.elem_limits = *elem_limits;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}